

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O0

Int Omega_h::get_metrics_dim(LO nmetrics,Reals *metrics)

{
  int ncomps_00;
  Int IVar1;
  int ncomps;
  Reals *metrics_local;
  LO nmetrics_local;
  ulong local_10;
  
  if (((ulong)(metrics->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((metrics->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(metrics->write_).shared_alloc_.alloc >> 3;
  }
  ncomps_00 = divide_no_remainder<int>((int)(local_10 >> 3),nmetrics);
  IVar1 = get_metric_dim(ncomps_00);
  return IVar1;
}

Assistant:

Int get_metrics_dim(LO nmetrics, Reals metrics) {
  auto ncomps = divide_no_remainder(metrics.size(), nmetrics);
  return get_metric_dim(ncomps);
}